

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SignedCastExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SignedCastExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax *args_2)

{
  Token signing;
  Token apostrophe;
  SignedCastExpressionSyntax *this_00;
  ParenthesizedExpressionSyntax *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SignedCastExpressionSyntax *)allocate(this,0x38,8);
  signing.kind = args->kind;
  signing._2_1_ = args->field_0x2;
  signing.numFlags.raw = (args->numFlags).raw;
  signing.rawLen = args->rawLen;
  signing.info = args->info;
  apostrophe.kind = args_1->kind;
  apostrophe._2_1_ = args_1->field_0x2;
  apostrophe.numFlags.raw = (args_1->numFlags).raw;
  apostrophe.rawLen = args_1->rawLen;
  apostrophe.info = args_1->info;
  slang::syntax::SignedCastExpressionSyntax::SignedCastExpressionSyntax
            (this_00,signing,apostrophe,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }